

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O0

size_t __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::GetNonEmptyHeapBlockCount
          (SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,bool checkCount)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  undefined4 *puVar7;
  size_t currentHeapBlockCount;
  bool checkCount_local;
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  sVar3 = SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          ::GetNonEmptyHeapBlockCount
                    (&this->
                      super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                     ,false);
  sVar4 = HeapBlockList::
          Count<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                    (this->pendingDisposeList);
  sVar5 = HeapBlockList::
          Count<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                    (this->tempPendingDisposeList);
  uVar6 = sVar3 + sVar4 + sVar5;
  if ((checkCount) &&
     ((this->
      super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
      ).
      super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
      .super_HeapBucket.heapBlockCount != uVar6)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBucket.cpp"
                       ,0x3f,"(!checkCount || this->heapBlockCount == currentHeapBlockCount)",
                       "!checkCount || this->heapBlockCount == currentHeapBlockCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return uVar6;
}

Assistant:

size_t
SmallFinalizableHeapBucketBaseT<TBlockType>::GetNonEmptyHeapBlockCount(bool checkCount) const
{
    size_t currentHeapBlockCount =  __super::GetNonEmptyHeapBlockCount(false)
        + HeapBlockList::Count(pendingDisposeList)
        + HeapBlockList::Count(tempPendingDisposeList);
    RECYCLER_SLOW_CHECK(Assert(!checkCount || this->heapBlockCount == currentHeapBlockCount));
    return currentHeapBlockCount;
}